

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void GetFormalArgsArray(ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                       PropertyIdArray *propIds)

{
  code *pcVar1;
  anon_class_32_4_fdc6cb32 fn;
  bool bVar2;
  undefined4 *puVar3;
  anon_class_32_4_fdc6cb32 processArg;
  ArgSlot i;
  PropertyIdArray *pPStack_20;
  bool hadDuplicates;
  PropertyIdArray *propIds_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  
  pPStack_20 = propIds;
  propIds_local = (PropertyIdArray *)funcInfo;
  funcInfo_local = (FuncInfo *)byteCodeGenerator;
  if (funcInfo == (FuncInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1f0,"(funcInfo)","funcInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (pPStack_20 == (PropertyIdArray *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1f1,"(propIds)","propIds");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (funcInfo_local == (FuncInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1f2,"(byteCodeGenerator)","byteCodeGenerator");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  processArg.hadDuplicates._7_1_ = 0;
  processArg.hadDuplicates._4_2_ = 0;
  processArg.i = (ArgSlot *)&stack0xffffffffffffffe0;
  processArg.propIds = (PropertyIdArray **)&funcInfo_local;
  processArg.byteCodeGenerator = (ByteCodeGenerator **)((long)&processArg.hadDuplicates + 7);
  fn.propIds = (PropertyIdArray **)processArg.i;
  fn.i = (ArgSlot *)((long)&processArg.hadDuplicates + 4);
  fn.byteCodeGenerator = (ByteCodeGenerator **)processArg.propIds;
  fn.hadDuplicates = (bool *)processArg.byteCodeGenerator;
  MapFormals<GetFormalArgsArray(ByteCodeGenerator*,FuncInfo*,Js::PropertyIdArray*)::__0>
            ((ParseNodeFnc *)propIds_local[0x3d],fn);
  pPStack_20->hadDuplicates = (Type)(processArg.hadDuplicates._7_1_ & 1);
  return;
}

Assistant:

void GetFormalArgsArray(ByteCodeGenerator *byteCodeGenerator, FuncInfo * funcInfo, Js::PropertyIdArray *propIds)
{
    Assert(funcInfo);
    Assert(propIds);
    Assert(byteCodeGenerator);

    bool hadDuplicates = false;
    Js::ArgSlot i = 0;

    auto processArg = [&](ParseNode *pnode)
    {
        if (pnode->IsVarLetOrConst())
        {
            Assert(i < propIds->count);
            Symbol *sym = pnode->AsParseNodeVar()->sym;
            Assert(sym);
            Js::PropertyId symPos = sym->EnsurePosition(byteCodeGenerator);

            //
            // Check if the function has any same name parameters
            // For the same name param, only the last one will be passed the correct propertyid
            // For remaining dup param names, pass Constants::NoProperty
            //
            for (Js::ArgSlot j = 0; j < i; j++)
            {
                if (propIds->elements[j] == symPos)
                {
                    // Found a dup parameter name
                    propIds->elements[j] = Js::Constants::NoProperty;
                    hadDuplicates = true;
                    break;
                }
            }
            propIds->elements[i] = symPos;
        }
        else
        {
            propIds->elements[i] = Js::Constants::NoProperty;
        }
        ++i;
    };
    MapFormals(funcInfo->root, processArg);

    propIds->hadDuplicates = hadDuplicates;
}